

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall
BasicBlock::RemovePred
          (BasicBlock *this,BasicBlock *block,FlowGraph *graph,bool doCleanSucc,bool moveToDead)

{
  RealCount *pRVar1;
  undefined1 *puVar2;
  BasicBlock *pBVar3;
  Type pSVar4;
  code *pcVar5;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *buffer;
  bool bVar6;
  Loop *loop;
  Type *ppFVar7;
  NodeBase *pNVar8;
  undefined4 *puVar9;
  undefined1 local_60 [8];
  EditingIterator iter;
  
  local_60 = (undefined1  [8])&this->predList;
  iter.super_Iterator.current = (NodeBase *)0x0;
  iter.super_Iterator.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_60;
  do {
    bVar6 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                      ((EditingIterator *)local_60);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xc7d,"((0))","Edge not found.");
      if (bVar6) {
        *puVar9 = 0;
        return;
      }
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_60);
    buffer = iter.super_Iterator.list;
  } while ((*ppFVar7)->predBlock != block);
  pBVar3 = (*ppFVar7)->succBlock;
  if (moveToDead) {
    pNVar8 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
             UnlinkCurrentNode((EditingIterator *)local_60);
    pNVar8->next = (this->deadPredList).
                   super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
                   super_SListNodeBase<Memory::ArenaAllocator>.next;
    (this->deadPredList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
    super_SListNodeBase<Memory::ArenaAllocator>.next = pNVar8;
    pRVar1 = &(this->deadPredList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
              super_RealCount;
    pRVar1->count = pRVar1->count + 1;
  }
  else {
    iter.last = (NodeBase *)graph->alloc;
    SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::UnlinkCurrentNode
              ((EditingIterator *)local_60);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)iter.last,
               buffer,0x10);
  }
  if (doCleanSucc) {
    RemoveSucc(block,this,graph,false,moveToDead);
  }
  if (((pBVar3->field_0x18 & 4) != 0) && (pBVar3->loop != (Loop *)0x0)) {
    pSVar4 = (pBVar3->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListNodeBase<Memory::ArenaAllocator>.next;
    if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar4 != &pBVar3->predList) &&
       ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar4->next == &pBVar3->predList))
    {
      puVar2 = &pBVar3->loop->field_0x178;
      *puVar2 = *puVar2 | 1;
    }
  }
  return;
}

Assistant:

void
BasicBlock::RemovePred(BasicBlock *block, FlowGraph * graph, bool doCleanSucc, bool moveToDead)
{
    FOREACH_SLISTBASECOUNTED_ENTRY_EDITING(FlowEdge*, edge, this->GetPredList(), iter)
    {
        if (edge->GetPred() == block)
        {
            BasicBlock *blockSucc = edge->GetSucc();
            if (moveToDead)
            {
                iter.MoveCurrentTo(this->GetDeadPredList());

            }
            else
            {
                iter.RemoveCurrent(graph->alloc);
            }
            if (doCleanSucc)
            {
                block->RemoveSucc(this, graph, false, moveToDead);
            }
            if (blockSucc->isLoopHeader && blockSucc->loop && blockSucc->GetPredList()->HasOne())
            {
                Loop *loop = blockSucc->loop;
                loop->isDead = true;
            }
            return;
        }
    } NEXT_SLISTBASECOUNTED_ENTRY_EDITING;
    AssertMsg(UNREACHED, "Edge not found.");
}